

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<netlist::ContinuousAssignVisitor,_false,_true,_false,_false>::
visit<slang::ast::AssignmentExpression>
          (ASTVisitor<netlist::ContinuousAssignVisitor,_false,_true,_false,_false> *this,
          AssignmentExpression *t)

{
  bool bVar1;
  Expression *in_RSI;
  AssignmentExpression *in_stack_00000118;
  ContinuousAssignVisitor *in_stack_00000120;
  
  bVar1 = Expression::bad(in_RSI);
  if (!bVar1) {
    netlist::ContinuousAssignVisitor::handle(in_stack_00000120,in_stack_00000118);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }